

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

Expression __thiscall dynet::expr::operator*(expr *this,Expression *x,float y)

{
  pointer *pppNVar1;
  ComputationGraph *this_00;
  iterator __position;
  Node *pNVar2;
  undefined8 extraout_RDX;
  Expression EVar3;
  initializer_list<dynet::VariableIndex> __l;
  allocator_type local_39;
  float local_38;
  VariableIndex local_34;
  Node *local_30;
  VariableIndex local_24;
  
  local_24.t = (x->i).t;
  this_00 = x->pg;
  local_34.t = (uint)((ulong)((long)(this_00->nodes).
                                    super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->nodes).
                                   super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_38 = y;
  pNVar2 = (Node *)operator_new(0x60);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_005a55e8;
  __l._M_len = 1;
  __l._M_array = &local_24;
  std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>::vector
            (&pNVar2->args,__l,&local_39);
  (pNVar2->dim).nd = 0;
  (pNVar2->dim).bd = 1;
  pNVar2->device = dynet::default_device;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_005aabd8;
  *(float *)&pNVar2[1]._vptr_Node = local_38;
  __position._M_current =
       (this_00->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_30 = pNVar2;
  if (__position._M_current ==
      (this_00->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this_00,__position,&local_30);
  }
  else {
    *__position._M_current = pNVar2;
    pppNVar1 = &(this_00->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  ComputationGraph::set_dim_for_new_node(this_00,&local_34);
  *(ComputationGraph **)this = this_00;
  *(uint *)(this + 8) = local_34.t;
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = (ComputationGraph *)this;
  return EVar3;
}

Assistant:

Expression operator*(const Expression& x, float y) { return Expression(x.pg, x.pg->add_function<ConstScalarMultiply>({x.i}, y)); }